

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void DoSetCVar(FBaseCVar *cvar,int value,bool is_string,bool force)

{
  uint32 uVar1;
  int iVar2;
  ECVarType local_24;
  undefined4 uStack_20;
  ECVarType type;
  UCVarValue val;
  bool force_local;
  bool is_string_local;
  int value_local;
  FBaseCVar *cvar_local;
  
  uVar1 = FBaseCVar::GetFlags(cvar);
  if (((uVar1 & 4) == 0) || (consoleplayer == Net_Arbitrator)) {
    if (is_string) {
      _uStack_20 = FBehavior::StaticLookupString(value);
      local_24 = CVAR_String;
    }
    else {
      iVar2 = (*cvar->_vptr_FBaseCVar[2])();
      if (iVar2 == 2) {
        uStack_20 = ACSToFloat(value);
        local_24 = CVAR_Float;
      }
      else {
        uStack_20 = value;
        local_24 = CVAR_Int;
      }
    }
    if (force) {
      FBaseCVar::ForceSet(cvar,_uStack_20,local_24,true);
    }
    else {
      FBaseCVar::SetGenericRep(cvar,_uStack_20,local_24);
    }
  }
  return;
}

Assistant:

static void DoSetCVar(FBaseCVar *cvar, int value, bool is_string, bool force=false)
{
	UCVarValue val;
	ECVarType type;

	// For serverinfo variables, only the arbitrator should set it.
	// The actual change to this cvar will not show up until it's
	// been replicated to all peers.
	if ((cvar->GetFlags() & CVAR_SERVERINFO) && consoleplayer != Net_Arbitrator)
	{
		return;
	}
	if (is_string)
	{
		val.String = FBehavior::StaticLookupString(value);
		type = CVAR_String;
	}
	else if (cvar->GetRealType() == CVAR_Float)
	{
		val.Float = ACSToFloat(value);
		type = CVAR_Float;
	}
	else
	{
		val.Int = value;
		type = CVAR_Int;
	}
	if (force)
	{
		cvar->ForceSet(val, type, true);
	}
	else
	{
		cvar->SetGenericRep(val, type);
	}
}